

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

bool slang::syntax::PathSuffixSyntax::isKind(SyntaxKind kind)

{
  return kind == SimplePathSuffix || kind == EdgeSensitivePathSuffix;
}

Assistant:

bool PathSuffixSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::EdgeSensitivePathSuffix:
        case SyntaxKind::SimplePathSuffix:
            return true;
        default:
            return false;
    }
}